

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_date.cpp
# Opt level: O3

void duckdb::ExecuteStructMakeDate<long>(DataChunk *input,ExpressionState *state,Vector *result)

{
  reference pvVar1;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  reference pvVar2;
  type a;
  type b;
  type c;
  
  pvVar1 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)input,0);
  this = (vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
          *)duckdb::StructVector::GetEntries(pvVar1);
  pvVar2 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
           ::operator[](this,0);
  a = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(pvVar2);
  pvVar2 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
           ::operator[](this,1);
  b = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(pvVar2);
  pvVar2 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
           ::operator[](this,2);
  c = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(pvVar2);
  TernaryExecutor::
  ExecuteGeneric<long,long,long,duckdb::date_t,duckdb::TernaryLambdaWrapper,duckdb::date_t(*)(long,long,long)>
            (a,b,c,result,*(idx_t *)(input + 0x18),FromDateCast<long>);
  return;
}

Assistant:

static void ExecuteStructMakeDate(DataChunk &input, ExpressionState &state, Vector &result) {
	// this should be guaranteed by the binder
	D_ASSERT(input.ColumnCount() == 1);
	auto &vec = input.data[0];

	auto &children = StructVector::GetEntries(vec);
	D_ASSERT(children.size() == 3);
	auto &yyyy = *children[0];
	auto &mm = *children[1];
	auto &dd = *children[2];

	TernaryExecutor::Execute<T, T, T, date_t>(yyyy, mm, dd, result, input.size(), FromDateCast<T>);
}